

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * cppcms::util::urlencode(string *s)

{
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  unaff_retaddr;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  string *content;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30 [3];
  undefined1 local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  
  local_11 = 0;
  b = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)in_RDI);
  std::
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::back_insert_iterator(local_30,in_RDI);
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  urlencode_impl<std::back_insert_iterator<std::__cxx11::string>>((char *)b,in_RSI,unaff_retaddr);
  return in_RDI;
}

Assistant:

std::string urlencode(std::string const &s)
{
	std::string content;
	content.reserve(3*s.size());
	std::back_insert_iterator<std::string> out(content);
	urlencode_impl(s.c_str(),s.c_str()+s.size(),out);
	return content;
}